

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  undefined1 uVar1;
  bool bVar2;
  Value *indentation_00;
  Value *nullSymbol_00;
  ulong uVar3;
  StreamWriter *pSVar4;
  string *in_RDI;
  Value *in_stack_00000058;
  string endingLineFeedSymbol;
  string nullSymbol;
  Value *in_stack_000000b8;
  string colonSymbol;
  Enum cs;
  bool dnp;
  bool eyc;
  string cs_str;
  string indentation;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffeb0;
  allocator *paVar5;
  Value *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffed8;
  Enum cs_00;
  BuiltStyledStreamWriter *in_stack_ffffffffffffff00;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [36];
  undefined4 local_5c;
  byte local_56;
  byte local_55;
  string local_48 [32];
  string local_28 [40];
  
  cs_00 = (Enum)((ulong)&in_RDI->_M_string_length >> 0x20);
  Value::operator[](in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
  Value::asString_abi_cxx11_(in_stack_000000b8);
  indentation_00 = Value::operator[](in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
  Value::asString_abi_cxx11_(in_stack_000000b8);
  nullSymbol_00 = Value::operator[](in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
  uVar1 = Value::asBool(in_stack_00000058);
  local_55 = uVar1;
  Value::operator[](in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
  local_56 = Value::asBool(in_stack_00000058);
  local_5c = 2;
  bVar2 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (bVar2) {
    local_5c = 2;
  }
  else {
    bVar2 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (bVar2) {
      local_5c = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"commentStyle must be \'All\' or \'None\'",&local_81);
      throwRuntimeError(in_stack_fffffffffffffeb0);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
  }
  paVar5 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8," : ",paVar5);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if ((local_55 & 1) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=(local_a8,":");
    }
  }
  else {
    std::__cxx11::string::operator=(local_a8,": ");
  }
  paVar5 = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"null",paVar5);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  if ((local_56 & 1) != 0) {
    std::__cxx11::string::operator=(local_d0,"");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"",(allocator *)&stack0xffffffffffffff07);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
  pSVar4 = (StreamWriter *)operator_new(0xe0);
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (in_stack_ffffffffffffff00,(string *)indentation_00,cs_00,in_RDI,(string *)nullSymbol_00
             ,(string *)CONCAT17(uVar1,in_stack_fffffffffffffed8));
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return pSVar4;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const
{
  std::string indentation = settings_["indentation"].asString();
  std::string cs_str = settings_["commentStyle"].asString();
  bool eyc = settings_["enableYAMLCompatibility"].asBool();
  bool dnp = settings_["dropNullPlaceholders"].asBool();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  std::string colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  std::string nullSymbol = "null";
  if (dnp) {
    nullSymbol = "";
  }
  std::string endingLineFeedSymbol = "";
  return new BuiltStyledStreamWriter(
      indentation, cs,
      colonSymbol, nullSymbol, endingLineFeedSymbol);
}